

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void reportLpColVectors(HighsLogOptions *log_options,HighsLp *lp)

{
  value_type vVar1;
  char *format;
  uint uVar2;
  HighsLogOptions *pHVar3;
  HighsInt HVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  undefined8 uVar8;
  const_reference pvVar9;
  int *in_RSI;
  HighsLogOptions *in_RDI;
  string integer_column;
  HighsInt iCol;
  bool have_col_names;
  bool have_integer_columns;
  HighsInt count;
  string type;
  HighsLp *in_stack_ffffffffffffff10;
  HighsLogOptions *pHVar10;
  undefined4 in_stack_ffffffffffffff30;
  value_type in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  allocator local_89;
  string local_88 [32];
  string local_68 [32];
  uint local_48;
  byte local_36;
  byte local_35;
  uint local_34;
  string local_30 [32];
  int *local_10;
  HighsLogOptions *local_8;
  
  if (0 < *in_RSI) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    std::__cxx11::string::string(local_30);
    HVar4 = getNumInt(in_stack_ffffffffffffff10);
    local_35 = HVar4 != 0;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(local_10 + 0x52));
    local_36 = sVar5 != 0;
    highsLogUser(local_8,kInfo,
                 "  Column        Lower        Upper         Cost       Type        Count");
    if ((local_35 & 1) != 0) {
      highsLogUser(local_8,kInfo,"  Discrete");
    }
    if ((local_36 & 1) != 0) {
      highsLogUser(local_8,kInfo,"  Name");
    }
    highsLogUser(local_8,kInfo,"\n");
    for (local_48 = 0; (int)local_48 < *local_10; local_48 = local_48 + 1) {
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_10 + 8),(long)(int)local_48);
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),(long)(int)local_48);
      getBoundType_abi_cxx11_
                ((double)in_stack_ffffffffffffff38,
                 (double)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      in_stack_ffffffffffffff38 = local_30;
      std::__cxx11::string::operator=(in_stack_ffffffffffffff38,local_68);
      std::__cxx11::string::~string(local_68);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),
                          (long)(int)(local_48 + 1));
      in_stack_ffffffffffffff34 = *pvVar6;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(local_10 + 0x24),(long)(int)local_48
                         );
      pHVar3 = local_8;
      uVar2 = local_48;
      local_34 = in_stack_ffffffffffffff34 - *pvVar6;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                          (long)(int)local_48);
      pHVar10 = (HighsLogOptions *)*pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                          (long)(int)local_48);
      vVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_10 + 2),
                          (long)(int)local_48);
      format = (char *)*pvVar7;
      uVar8 = std::__cxx11::string::c_str();
      highsLogUser(pHVar10,(HighsLogType)vVar1,format,pHVar3,1,"%8d %12g %12g %12g         %2s %12d"
                   ,(ulong)uVar2,uVar8,(ulong)local_34);
      if ((local_35 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_88,"",&local_89);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        pvVar9 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                           ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(local_10 + 0x5e)
                            ,(long)(int)local_48);
        if (*pvVar9 == kInteger) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_10 + 8),
                              (long)(int)local_48);
          if ((*pvVar7 == 0.0) && (!NAN(*pvVar7))) {
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                                (long)(int)local_48);
            if ((*pvVar7 == 1.0) && (!NAN(*pvVar7))) {
              std::__cxx11::string::operator=(local_88,"Binary");
              goto LAB_004fe359;
            }
          }
          std::__cxx11::string::operator=(local_88,"Integer");
        }
LAB_004fe359:
        pHVar10 = local_8;
        uVar8 = std::__cxx11::string::c_str();
        highsLogUser(pHVar10,kInfo,"  %-8s",uVar8);
        std::__cxx11::string::~string(local_88);
      }
      if ((local_36 & 1) != 0) {
        pHVar10 = local_8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_10 + 0x52),(long)(int)local_48);
        uVar8 = std::__cxx11::string::c_str();
        highsLogUser(pHVar10,kInfo,"  %-s",uVar8);
      }
      highsLogUser(local_8,kInfo,"\n");
    }
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void reportLpColVectors(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.num_col_ <= 0) return;
  std::string type;
  HighsInt count;
  bool have_integer_columns = (getNumInt(lp) != 0);
  bool have_col_names = (lp.col_names_.size() != 0);

  highsLogUser(log_options, HighsLogType::kInfo,
               "  Column        Lower        Upper         Cost       "
               "Type        Count");
  if (have_integer_columns)
    highsLogUser(log_options, HighsLogType::kInfo, "  Discrete");
  if (have_col_names) highsLogUser(log_options, HighsLogType::kInfo, "  Name");
  highsLogUser(log_options, HighsLogType::kInfo, "\n");

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    type = getBoundType(lp.col_lower_[iCol], lp.col_upper_[iCol]);
    count = lp.a_matrix_.start_[iCol + 1] - lp.a_matrix_.start_[iCol];
    highsLogUser(log_options, HighsLogType::kInfo,
                 "%8" HIGHSINT_FORMAT
                 " %12g %12g %12g         %2s %12" HIGHSINT_FORMAT "",
                 iCol, lp.col_lower_[iCol], lp.col_upper_[iCol],
                 lp.col_cost_[iCol], type.c_str(), count);
    if (have_integer_columns) {
      std::string integer_column = "";
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == 1) {
          integer_column = "Binary";
        } else {
          integer_column = "Integer";
        }
      }
      highsLogUser(log_options, HighsLogType::kInfo, "  %-8s",
                   integer_column.c_str());
    }
    if (have_col_names)
      highsLogUser(log_options, HighsLogType::kInfo, "  %-s",
                   lp.col_names_[iCol].c_str());
    highsLogUser(log_options, HighsLogType::kInfo, "\n");
  }
}